

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::UpdateMouseMovingWindowEndFrame(void)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  ImGuiWindow *pIVar3;
  ImGuiWindow *pIVar4;
  ImRect local_20;
  
  pIVar1 = GImGui;
  if (GImGui->ActiveId != 0) {
    return;
  }
  if (GImGui->HoveredId == 0) {
    pIVar3 = GImGui->NavWindow;
    if ((pIVar3 != (ImGuiWindow *)0x0) && (pIVar3->Appearing != false)) {
      return;
    }
    if ((GImGui->IO).MouseClicked[0] == true) {
      pIVar4 = GImGui->HoveredRootWindow;
      if (pIVar4 == (ImGuiWindow *)0x0) {
        if ((pIVar3 != (ImGuiWindow *)0x0) &&
           (pIVar3 = GetTopMostPopupModal(), pIVar3 == (ImGuiWindow *)0x0)) {
          FocusWindow((ImGuiWindow *)0x0);
        }
      }
      else if (((pIVar4->Flags & 0x4000000) == 0) ||
              (bVar2 = IsPopupOpen(pIVar4->PopupId,0x100), bVar2)) {
        StartMouseMovingWindow(pIVar1->HoveredWindow);
        if (((pIVar1->IO).ConfigWindowsMoveFromTitleBarOnly == true) && ((pIVar4->Flags & 1) == 0))
        {
          local_20 = ImGuiWindow::TitleBarRect(pIVar4);
          bVar2 = ImRect::Contains(&local_20,(pIVar1->IO).MouseClickedPos);
          if (!bVar2) {
            pIVar1->MovingWindow = (ImGuiWindow *)0x0;
          }
        }
        if (pIVar1->HoveredIdDisabled == true) {
          pIVar1->MovingWindow = (ImGuiWindow *)0x0;
        }
      }
    }
    if ((pIVar1->IO).MouseClicked[1] == true) {
      pIVar4 = GetTopMostPopupModal();
      pIVar3 = pIVar1->HoveredWindow;
      if ((pIVar3 != (ImGuiWindow *)0x0) && (bVar2 = IsWindowAbove(pIVar3,pIVar4), bVar2)) {
        pIVar4 = pIVar3;
      }
      ClosePopupsOverWindow(pIVar4,true);
    }
    return;
  }
  return;
}

Assistant:

void ImGui::UpdateMouseMovingWindowEndFrame()
{
    ImGuiContext& g = *GImGui;
    if (g.ActiveId != 0 || g.HoveredId != 0)
        return;

    // Unless we just made a window/popup appear
    if (g.NavWindow && g.NavWindow->Appearing)
        return;

    // Click on empty space to focus window and start moving
    // (after we're done with all our widgets)
    if (g.IO.MouseClicked[0])
    {
        // Handle the edge case of a popup being closed while clicking in its empty space.
        // If we try to focus it, FocusWindow() > ClosePopupsOverWindow() will accidentally close any parent popups because they are not linked together any more.
        ImGuiWindow* root_window = g.HoveredRootWindow;
        const bool is_closed_popup = root_window && (root_window->Flags & ImGuiWindowFlags_Popup) && !IsPopupOpen(root_window->PopupId, ImGuiPopupFlags_AnyPopupLevel);

        if (root_window != NULL && !is_closed_popup)
        {
            StartMouseMovingWindow(g.HoveredWindow); //-V595

            // Cancel moving if clicked outside of title bar
            if (g.IO.ConfigWindowsMoveFromTitleBarOnly && !(root_window->Flags & ImGuiWindowFlags_NoTitleBar))
                if (!root_window->TitleBarRect().Contains(g.IO.MouseClickedPos[0]))
                    g.MovingWindow = NULL;

            // Cancel moving if clicked over an item which was disabled or inhibited by popups (note that we know HoveredId == 0 already)
            if (g.HoveredIdDisabled)
                g.MovingWindow = NULL;
        }
        else if (root_window == NULL && g.NavWindow != NULL && GetTopMostPopupModal() == NULL)
        {
            // Clicking on void disable focus
            FocusWindow(NULL);
        }
    }

    // With right mouse button we close popups without changing focus based on where the mouse is aimed
    // Instead, focus will be restored to the window under the bottom-most closed popup.
    // (The left mouse button path calls FocusWindow on the hovered window, which will lead NewFrame->ClosePopupsOverWindow to trigger)
    if (g.IO.MouseClicked[1])
    {
        // Find the top-most window between HoveredWindow and the top-most Modal Window.
        // This is where we can trim the popup stack.
        ImGuiWindow* modal = GetTopMostPopupModal();
        bool hovered_window_above_modal = g.HoveredWindow && IsWindowAbove(g.HoveredWindow, modal);
        ClosePopupsOverWindow(hovered_window_above_modal ? g.HoveredWindow : modal, true);
    }
}